

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall ImgfsFile::FileEntry::FileEntry(FileEntry *this,string *name)

{
  (this->super_DirEntry)._indexsize = 0;
  (this->super_DirEntry)._size = 0;
  (this->super_DirEntry)._ofs = 0;
  (this->super_DirEntry)._magic = 0;
  (this->super_DirEntry)._indexptr = 0;
  (this->super_DirEntry)._vptr_DirEntry = (_func_int **)&PTR__FileEntry_001432e8;
  nameinfo::nameinfo(&this->_name,name);
  (this->super_DirEntry)._magic = 0xfffff6fe;
  (this->super_DirEntry)._indexptr = 0;
  this->_attr = 0x41;
  this->_filetime = 0;
  this->_reserved = 0;
  (this->super_DirEntry)._indexsize = 0;
  (this->super_DirEntry)._size = 0;
  this->_datatable = 0;
  this->_sectionlist = 0;
  return;
}

Assistant:

explicit FileEntry(const std::string& name)
            : _name(name)
        {
            _magic= MAGIC;
            _datatable=0;
            _sectionlist=0;
            _size=0;
            _attr= 0x41;
            _filetime= 0;
            _reserved= 0;
            _indexptr=0;
            _indexsize=0;
        }